

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O0

int pt_tcal_update_ovf(pt_time_cal *tcal,pt_config *config)

{
  pt_config *config_local;
  pt_time_cal *tcal_local;
  
  if ((tcal == (pt_time_cal *)0x0) || (config == (pt_config *)0x0)) {
    tcal_local._4_4_ = -1;
  }
  else {
    tcal->tsc = 0;
    tcal->cyc_tsc = 0;
    tcal->cyc_mtc = 0;
    tcal->ctc = 0;
    tcal->field_0x38 = tcal->field_0x38 & 0xfe;
    tcal_local._4_4_ = 0;
  }
  return tcal_local._4_4_;
}

Assistant:

int pt_tcal_update_ovf(struct pt_time_cal *tcal,
		       const struct pt_config *config)
{
	if (!tcal || !config)
		return -pte_internal;

	tcal->tsc = 0ull;
	tcal->cyc_tsc = 0ull;
	tcal->cyc_mtc = 0ull;
	tcal->ctc = 0;
	tcal->have_mtc = 0;

	return 0;
}